

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotation.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotation::SetSpindleConstraint
          (ChLinkMotorRotation *this,bool mc_x,bool mc_y,bool mc_z,bool mc_rx,bool mc_ry)

{
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_x = mc_x;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = mc_y;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = mc_z;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = mc_rx;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = mc_ry;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  return;
}

Assistant:

void ChLinkMotorRotation::SetSpindleConstraint(bool mc_x, bool mc_y, bool mc_z, bool mc_rx, bool mc_ry) {
    this->c_x = mc_x;
    this->c_y = mc_y;
    this->c_z = mc_z;
    this->c_rx = mc_rx;
    this->c_ry = mc_ry;
    SetupLinkMask();
}